

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O0

void __thiscall Rml::FontEffectGlowInstancer::FontEffectGlowInstancer(FontEffectGlowInstancer *this)

{
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_389;
  String local_388;
  allocator<char> local_361;
  String local_360;
  allocator<char> local_339;
  String local_338;
  allocator<char> local_311;
  String local_310;
  allocator<char> local_2e9;
  String local_2e8;
  allocator<char> local_2c1;
  String local_2c0;
  allocator<char> local_299;
  String local_298;
  allocator<char> local_271;
  String local_270;
  allocator<char> local_249;
  String local_248;
  allocator<char> local_221;
  String local_220;
  allocator<char> local_1f9;
  String local_1f8;
  allocator<char> local_1d1;
  String local_1d0;
  allocator<char> local_1a9;
  String local_1a8;
  allocator<char> local_181;
  String local_180;
  allocator<char> local_159;
  String local_158;
  allocator<char> local_131;
  String local_130;
  allocator<char> local_109;
  String local_108;
  allocator<char> local_e1;
  String local_e0;
  allocator<char> local_b9;
  String local_b8;
  allocator<char> local_91;
  String local_90;
  allocator<char> local_69;
  String local_68;
  allocator<char> local_31;
  String local_30;
  FontEffectGlowInstancer *local_10;
  FontEffectGlowInstancer *this_local;
  
  local_10 = this;
  FontEffectInstancer::FontEffectInstancer(&this->super_FontEffectInstancer);
  (this->super_FontEffectInstancer)._vptr_FontEffectInstancer =
       (_func_int **)&PTR__FontEffectGlowInstancer_00817aa0;
  this->id_width_outline = Invalid;
  this->id_width_blur = Invalid;
  this->id_color = Invalid;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"width-outline",&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"1px",&local_69);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_30,&local_68,true);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"length",&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_90,&local_b8);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_width_outline = PVar1;
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator(&local_b9);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"width-blur",&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"-1px",&local_109);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_e0,&local_108,true);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"length",&local_131);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_130,&local_158);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_width_blur = PVar1;
  ::std::__cxx11::string::~string((string *)&local_158);
  ::std::allocator<char>::~allocator(&local_159);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::allocator<char>::~allocator(&local_131);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::allocator<char>::~allocator(&local_109);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::allocator<char>::~allocator(&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"offset-x",&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"0px",&local_1a9);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_180,&local_1a8,true);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"length",&local_1d1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_1d0,&local_1f8);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_offset_x = PVar1;
  ::std::__cxx11::string::~string((string *)&local_1f8);
  ::std::allocator<char>::~allocator(&local_1f9);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  ::std::allocator<char>::~allocator(&local_1d1);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::allocator<char>::~allocator(&local_1a9);
  ::std::__cxx11::string::~string((string *)&local_180);
  ::std::allocator<char>::~allocator(&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"offset-y",&local_221);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"0px",&local_249);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_220,&local_248,true);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"length",&local_271);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_270,&local_298);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_offset_y = PVar1;
  ::std::__cxx11::string::~string((string *)&local_298);
  ::std::allocator<char>::~allocator(&local_299);
  ::std::__cxx11::string::~string((string *)&local_270);
  ::std::allocator<char>::~allocator(&local_271);
  ::std::__cxx11::string::~string((string *)&local_248);
  ::std::allocator<char>::~allocator(&local_249);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::allocator<char>::~allocator(&local_221);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"color",&local_2c1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"white",&local_2e9);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_2c0,&local_2e8,false);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"color",&local_311);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"",&local_339);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_310,&local_338);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_color = PVar1;
  ::std::__cxx11::string::~string((string *)&local_338);
  ::std::allocator<char>::~allocator(&local_339);
  ::std::__cxx11::string::~string((string *)&local_310);
  ::std::allocator<char>::~allocator(&local_311);
  ::std::__cxx11::string::~string((string *)&local_2e8);
  ::std::allocator<char>::~allocator(&local_2e9);
  ::std::__cxx11::string::~string((string *)&local_2c0);
  ::std::allocator<char>::~allocator(&local_2c1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"font-effect",&local_361);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"width-outline, width-blur, offset-x, offset-y, color",&local_389)
  ;
  FontEffectInstancer::RegisterShorthand
            (&this->super_FontEffectInstancer,&local_360,&local_388,FallThrough);
  ::std::__cxx11::string::~string((string *)&local_388);
  ::std::allocator<char>::~allocator(&local_389);
  ::std::__cxx11::string::~string((string *)&local_360);
  ::std::allocator<char>::~allocator(&local_361);
  return;
}

Assistant:

FontEffectGlowInstancer::FontEffectGlowInstancer() :
	id_width_outline(PropertyId::Invalid), id_width_blur(PropertyId::Invalid), id_color(PropertyId::Invalid)
{
	id_width_outline = RegisterProperty("width-outline", "1px", true).AddParser("length").GetId();
	id_width_blur = RegisterProperty("width-blur", "-1px", true).AddParser("length").GetId();
	id_offset_x = RegisterProperty("offset-x", "0px", true).AddParser("length").GetId();
	id_offset_y = RegisterProperty("offset-y", "0px", true).AddParser("length").GetId();
	id_color = RegisterProperty("color", "white", false).AddParser("color").GetId();
	RegisterShorthand("font-effect", "width-outline, width-blur, offset-x, offset-y, color", ShorthandType::FallThrough);
}